

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_jordan.cpp
# Opt level: O0

void opengv::math::gauss_jordan
               (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                *matrix,int exitCondition)

{
  value_type vVar1;
  value_type *pvVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  int iVar4;
  int iVar5;
  value_type vVar6;
  double dVar7;
  size_type sVar8;
  reference ppvVar9;
  reference pvVar10;
  reference __b;
  reference pvVar11;
  int in_ESI;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *in_RDI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int col_3;
  double leadingCoefficient_1;
  int row_1;
  vector<int,_std::allocator<int>_> nonzeroIdx_1;
  int col_2;
  int col_1;
  double leadingCoefficient;
  vector<int,_std::allocator<int>_> nonzeroIdx;
  double leadingCoefficient_inv;
  int col;
  double value;
  int tempRow;
  int row;
  double maxValue;
  int frontRow;
  int cols;
  int rows;
  double precision;
  value_type *in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  value_type in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff10;
  int local_b4;
  int local_a4;
  vector<int,_std::allocator<int>_> local_a0;
  int local_88;
  int local_84;
  value_type local_80;
  vector<int,_std::allocator<int>_> local_68;
  double local_50;
  int local_44;
  double local_40;
  int local_38;
  int local_34;
  double local_30;
  int local_24;
  int local_20;
  int local_1c;
  double local_18;
  int local_c;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *local_8;
  
  local_18 = 1e-10;
  local_c = in_ESI;
  local_8 = in_RDI;
  sVar8 = std::
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          ::size(in_RDI);
  local_1c = (int)sVar8;
  ppvVar9 = std::
            vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            ::operator[](local_8,0);
  sVar8 = std::vector<double,_std::allocator<double>_>::size(*ppvVar9);
  local_20 = (int)sVar8;
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    local_30 = -1.0;
    local_34 = -1;
    for (local_38 = local_24; local_38 < local_1c; local_38 = local_38 + 1) {
      ppvVar9 = std::
                vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                ::operator[](local_8,(long)local_38);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_24);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *pvVar10;
      auVar19._8_8_ = 0x7fffffffffffffff;
      auVar19._0_8_ = 0x7fffffffffffffff;
      auVar12 = vpand_avx(auVar12,auVar19);
      local_40 = auVar12._0_8_;
      if (local_30 < local_40) {
        local_34 = local_38;
        local_30 = local_40;
      }
    }
    ppvVar9 = std::
              vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              ::operator[](local_8,(long)local_34);
    __b = std::
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          ::operator[](local_8,(long)local_24);
    std::swap<std::vector<double,std::allocator<double>>*>(ppvVar9,__b);
    local_44 = local_24;
    ppvVar9 = std::
              vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              ::operator[](local_8,(long)local_24);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_44);
    local_50 = 1.0 / *pvVar10;
    ppvVar9 = std::
              vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              ::operator[](local_8,(long)local_24);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_44);
    *pvVar10 = 1.0;
    while (dVar7 = local_50, local_44 = local_44 + 1, local_44 < local_20) {
      ppvVar9 = std::
                vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                ::operator[](local_8,(long)local_24);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_44);
      *pvVar10 = dVar7 * *pvVar10;
    }
    local_44 = local_24;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb1146e);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    for (; iVar4 = local_24, local_44 < local_20; local_44 = local_44 + 1) {
      ppvVar9 = std::
                vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                ::operator[](local_8,(long)local_24);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_44);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *pvVar10;
      auVar20._8_8_ = 0x7fffffffffffffff;
      auVar20._0_8_ = 0x7fffffffffffffff;
      auVar12 = vpand_avx(auVar13,auVar20);
      if (local_18 < auVar12._0_8_) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
    }
    while (local_34 = iVar4 + 1, local_34 < local_1c) {
      local_44 = local_24;
      ppvVar9 = std::
                vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                ::operator[](local_8,(long)local_34);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_44);
      local_80 = *pvVar10;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_80;
      auVar21._8_8_ = 0x7fffffffffffffff;
      auVar21._0_8_ = 0x7fffffffffffffff;
      auVar12 = vpand_avx(auVar14,auVar21);
      iVar4 = local_34;
      if (local_18 < auVar12._0_8_) {
        for (local_84 = 0; iVar5 = local_84,
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_68), vVar6 = local_80,
            iVar4 = local_34, iVar5 < (int)sVar8; local_84 = local_84 + 1) {
          ppvVar9 = std::
                    vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                    ::operator[](local_8,(long)local_24);
          in_stack_ffffffffffffff08 = *ppvVar9;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_84);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_ffffffffffffff08,(long)*pvVar11);
          vVar1 = *pvVar10;
          ppvVar9 = std::
                    vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                    ::operator[](local_8,(long)local_34);
          in_stack_ffffffffffffff10 = *ppvVar9;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_84);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (in_stack_ffffffffffffff10,(long)*pvVar11);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = vVar1;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *pvVar10;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = -vVar6;
          auVar12 = vfmadd213sd_fma(auVar15,auVar22,auVar26);
          *pvVar10 = auVar12._0_8_;
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffef0);
  }
  local_24 = local_24 + -1;
  while (local_c < local_24) {
    local_88 = local_24;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb11760);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    for (; local_88 < local_20; local_88 = local_88 + 1) {
      ppvVar9 = std::
                vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                ::operator[](local_8,(long)local_24);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_88);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *pvVar10;
      auVar23._8_8_ = 0x7fffffffffffffff;
      auVar23._0_8_ = 0x7fffffffffffffff;
      auVar12 = vpand_avx(auVar16,auVar23);
      if (local_18 < auVar12._0_8_) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
    }
    local_a4 = local_24;
    do {
      local_a4 = local_a4 + -1;
      ppvVar9 = std::
                vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                ::operator[](local_8,(long)local_a4);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](*ppvVar9,(long)local_24);
      pvVar2 = (value_type *)*pvVar10;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pvVar2;
      auVar24._8_8_ = 0x7fffffffffffffff;
      auVar24._0_8_ = 0x7fffffffffffffff;
      auVar12 = vpand_avx(auVar17,auVar24);
      if (local_18 < auVar12._0_8_) {
        for (local_b4 = 0; sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_a0),
            local_b4 < (int)sVar8; local_b4 = local_b4 + 1) {
          in_stack_fffffffffffffee8 = pvVar2;
          ppvVar9 = std::
                    vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                    ::operator[](local_8,(long)local_24);
          pvVar3 = *ppvVar9;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_b4);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)*pvVar11);
          in_stack_fffffffffffffef0 = (vector<int,_std::allocator<int>_> *)*pvVar10;
          ppvVar9 = std::
                    vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                    ::operator[](local_8,(long)local_a4);
          pvVar3 = *ppvVar9;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_b4);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)*pvVar11);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = in_stack_fffffffffffffef0;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *pvVar10;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = -(double)in_stack_fffffffffffffee8;
          auVar12 = vfmadd213sd_fma(auVar18,auVar25,auVar27);
          *pvVar10 = auVar12._0_8_;
        }
      }
    } while (local_c < local_a4);
    local_24 = local_24 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void
opengv::math::gauss_jordan(
    std::vector<std::vector<double>*> & matrix, int exitCondition )
{  
  //create some constants for zero-checking etc.
  double precision = 1.0e-10;
  int rows = matrix.size();
  int cols = matrix[0]->size();
  
  //the working row
  int frontRow;
  
  //first step down
  for( frontRow = 0; frontRow < rows; frontRow++ )
  {
    // first iterate through the rows and find the row that has the biggest
    // leading coefficient
    double maxValue = -1.0;
    int row = -1;
    for( int tempRow = frontRow; tempRow < rows; tempRow++ )
    {
      double value = fabs((*(matrix[tempRow]))[frontRow]);
      if( value > maxValue )
      {
        row = tempRow;
        maxValue = value;
      }
    }
    
    //rowIter is now the row that should go in the place of frontRow->swap    
    std::swap( matrix[row], matrix[frontRow] );
    
    //ok, now use frontRow!
    
    //first divide all coefficients by the leading coefficient
    int col = frontRow;
    double leadingCoefficient_inv = 1.0 / (*(matrix[frontRow]))[col];
    (*(matrix[frontRow]))[col] = 1.0;
    ++col;
    while( col < cols )
    {
      (*(matrix[frontRow]))[col] *= leadingCoefficient_inv;
      ++col;
    }
    
    //create a vector of bools indicating the cols that need to be manipulated
    col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //iterate through all remaining rows, and subtract correct multiple of 
    //first row (if leading coefficient is non-zero!)
    row = frontRow;
    ++row;
    while( row < rows )
    {
      col = frontRow;
      double leadingCoefficient = (*(matrix[row]))[col];
      
      if( fabs(leadingCoefficient) > precision )
      {
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * ((*(matrix[frontRow]))[nonzeroIdx[col]]);
      }
      
      ++row;
    }
  }
  
  //set index to the last non-zero row
  --frontRow;
  
  //Now step up
  while( frontRow > exitCondition )
  {    
    //create a vector of bools indicating the cols that need to be manipulated
    int col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //get the working row
    int row = frontRow;
    
    do
    {      
      //decrement working row
      --row;
      
      //working column
      
      //now get the leading coefficient
      double leadingCoefficient = (*(matrix[row]))[frontRow];
      
      //Now iterator until the end, and subtract each time the multiplied
      //front-row
      if( fabs(leadingCoefficient) > precision )
      {        
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * (*(matrix[frontRow]))[nonzeroIdx[col]];
      }
    }
    while( row > exitCondition );
    
    --frontRow;
  }
}